

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O1

void mnf::ExpMapMatrix::logarithm(RefVec *out,OutputType *R)

{
  void *__dest;
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  Vector3d v;
  double local_78 [4];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_78[0] = -(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array[7];
  local_58 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3];
  uStack_50 = 0;
  local_78[2] = -local_58;
  local_78[1] = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[6];
  dVar5 = acos(((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[4] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[8] +
                (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[0] + -1.0) * 0.5);
  if (1e-08 <= SQRT(local_58 * local_58 + local_78[1] * local_78[1] + local_78[0] * local_78[0])) {
    local_58 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] -
               (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3];
    local_40 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5] -
               (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7];
    local_38 = (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6] -
               (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
    local_48 = dVar5;
    dVar5 = sin(dVar5);
    local_78[2] = local_48 / (dVar5 + dVar5);
    local_78[0] = local_40 * local_78[2];
    local_78[1] = local_38 * local_78[2];
    local_78[2] = local_78[2] * local_58;
  }
  if (*(long *)&(out->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).field_0x8 == 3) {
    __dest = *(void **)&out->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    uVar4 = 3;
    if ((((ulong)__dest & 7) == 0) && (uVar4 = (ulong)((uint)((ulong)__dest >> 3) & 1), 2 < uVar4))
    {
      uVar4 = 3;
    }
    lVar2 = 3 - uVar4;
    if (uVar4 != 0) {
      memcpy(__dest,local_78,uVar4 * 8);
    }
    lVar3 = (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) + uVar4;
    if (1 < lVar2) {
      lVar1 = uVar4 + 2;
      if ((long)(uVar4 + 2) < lVar3) {
        lVar1 = lVar3;
      }
      memcpy((void *)((long)__dest + uVar4 * 8),local_78 + uVar4,
             (~uVar4 + lVar1 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (lVar3 < 3) {
      memcpy((void *)((long)__dest + uVar4 * 8 + (lVar2 / 2) * 0x10),
             local_78 + (lVar2 / 2) * 2 + uVar4,lVar3 * -8 + 0x18);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
               );
}

Assistant:

void ExpMapMatrix::logarithm(RefVec out, const OutputType& R)
{
  Eigen::Vector3d v(-R(1, 2), R(0, 2), -R(0, 1));
  double acosTr = std::acos((R.trace() - 1) / 2);
  if (v.norm() < prec)
    out = v;
  else
  {
    OutputType diff(R - R.transpose());
    double coeff = acosTr / (2 * std::sin(acosTr));
    v(0) = diff(2, 1) * coeff;
    v(1) = diff(0, 2) * coeff;
    v(2) = diff(1, 0) * coeff;
    out = v;
  }
}